

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall Parser::Register<DivOp>(Parser *this)

{
  IOperation *pIVar1;
  IOperation *this_00;
  mapped_type *pmVar2;
  string local_30;
  
  this_00 = (IOperation *)operator_new(8);
  ((IOperation *)&this_00->_vptr_IOperation)->_vptr_IOperation =
       (_func_int **)&PTR_GetName_abi_cxx11__00109d18;
  DivOp::GetName_abi_cxx11_(&local_30,(DivOp *)this_00);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<IOperation,_std::default_delete<IOperation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<IOperation,_std::default_delete<IOperation>_>_>_>_>
           ::operator[](&this->operations_,&local_30);
  pIVar1 = (pmVar2->_M_t).super___uniq_ptr_impl<IOperation,_std::default_delete<IOperation>_>._M_t.
           super__Tuple_impl<0UL,_IOperation_*,_std::default_delete<IOperation>_>.
           super__Head_base<0UL,_IOperation_*,_false>._M_head_impl;
  (pmVar2->_M_t).super___uniq_ptr_impl<IOperation,_std::default_delete<IOperation>_>._M_t.
  super__Tuple_impl<0UL,_IOperation_*,_std::default_delete<IOperation>_>.
  super__Head_base<0UL,_IOperation_*,_false>._M_head_impl = this_00;
  if (pIVar1 != (IOperation *)0x0) {
    (*pIVar1->_vptr_IOperation[4])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Register(Args &&... args) {
    auto op = new TOperation(std::forward<Args>(args)...);
    operations_[op->GetName()] = std::unique_ptr<IOperation>(op);
  }